

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O2

void CVmBifT3::get_named_arg(uint argc)

{
  ushort uVar1;
  vm_val_t *fp;
  vm_val_t *val;
  int iVar2;
  ushort *puVar3;
  ushort *puVar4;
  ushort *puVar5;
  vm_val_t **ppvVar6;
  uint uVar7;
  vm_val_t *argp;
  
  CVmBif::check_argc_range(argc,1,2);
  puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
  if (puVar3 == (ushort *)0x0) {
    err_throw(0x7e3);
  }
  uVar1 = *puVar3;
  ppvVar6 = &frame_ptr_;
  do {
    fp = *ppvVar6;
    if (fp == (vm_val_t *)0x0) {
      if (1 < argc) {
        CVmBif::retval(sp_ + -2);
        sp_ = sp_ + -(long)(int)argc;
        return;
      }
      err_throw_a(0x89c,1,4,puVar3 + 1,(ulong)uVar1);
    }
    puVar4 = (ushort *)CVmRun::get_named_args_from_frame(fp,&argp);
    if (puVar4 != (ushort *)0x0) {
      puVar5 = puVar4 + 2;
      for (uVar7 = (uint)*puVar4; val = argp, -1 < (int)uVar7; uVar7 = uVar7 - 1) {
        if (((uint)*puVar5 - (uint)puVar5[-1] == (uint)uVar1) &&
           (iVar2 = bcmp(puVar3 + 1,(void *)((long)puVar4 + (ulong)puVar5[-1] + 2),(ulong)uVar1),
           iVar2 == 0)) {
          CVmBif::retval(val);
          sp_ = sp_ + -(long)(int)argc;
          return;
        }
        argp = val + 1;
        puVar5 = puVar5 + 1;
      }
    }
    ppvVar6 = (vm_val_t **)&fp[-1].val;
  } while( true );
}

Assistant:

void CVmBifT3::get_named_arg(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* get the name we're looking for */
    const char *name = G_stk->get(0)->get_as_string(vmg0_);
    if (name == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer pointer */
    size_t namelen = vmb_get_len(name);
    name += VMB_LEN;

    /* 
     *   Scan the stack for named parameter tables.  A named parameter table
     *   is always in the calling frame at the stack slot just beyond the
     *   last argument.  
     */
    for (vm_val_t *fp = G_interpreter->get_frame_ptr() ; fp != 0 ;
         fp = G_interpreter->get_enclosing_frame_ptr(vmg_ fp))
    {
        /* check for a table in this frame */
        vm_val_t *argp;
        const uchar *t = CVmRun::get_named_args_from_frame(vmg_ fp, &argp);
        if (t != 0)
        {
            /* get the number of table entries */
            int n = osrp2(t);
            t += 2;

            /* scan the table for the name */
            for (int i = 0 ; n >= 0 ; --n, i += 2, ++argp)
            {
                /* get this element's offset, and figure its length */
                uint eofs = osrp2(t + i);
                uint elen = osrp2(t + i + 2) - eofs;

                /* check for a match */
                if (elen == namelen && memcmp(name, t + eofs, elen) == 0)
                {
                    /* found it - return the value */
                    retval(vmg_ argp);

                    /* discard arguments and return */
                    G_stk->discard(argc);
                    return;
                }
            }
        }
    }

    /* 
     *   The argument is undefined.  If a default value was supplied, simply
     *   return the default value.  Otherwise throw an error.  
     */
    if (argc >= 2)
    {
        /* a default value was supplied - simply return it */
        retval(vmg_ G_stk->get(1));

        /* discard arguments */
        G_stk->discard(argc);
    }
    else
    {
        /* no default value - throw an error */
        err_throw_a(VMERR_MISSING_NAMED_ARG, 1, ERR_TYPE_TEXTCHAR_LEN,
                    name, namelen);
    }
}